

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O1

void ipred_dc_uv(pel *src,pel *dst,int i_dst,int w,int h,u16 avail_cu,int bit_depth)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  short sVar5;
  int iVar7;
  byte *pbVar8;
  int iVar9;
  ulong uVar10;
  int iVar6;
  
  uVar1 = w * 2;
  if ((avail_cu & 2) == 0) {
    if ((avail_cu & 1) == 0) {
      iVar6 = 1 << ((char)bit_depth - 1U & 0x1f);
      sVar5 = (short)iVar6;
    }
    else {
      if ((int)uVar1 < 1) {
        iVar6 = 0;
        iVar9 = 0;
      }
      else {
        uVar10 = 0;
        iVar9 = 0;
        iVar6 = 0;
        do {
          lVar2 = uVar10 + 2;
          lVar3 = uVar10 + 3;
          uVar10 = uVar10 + 2;
          iVar9 = iVar9 + (uint)src[lVar2];
          iVar6 = iVar6 + (uint)src[lVar3];
        } while (uVar10 < uVar1);
      }
      sVar5 = (short)(iVar9 + (w >> 1) >> (g_tbl_log2[w] & 0x1fU));
      iVar6 = (w >> 1) + iVar6 >> (g_tbl_log2[w] & 0x1fU);
    }
  }
  else {
    if (h * 2 < 1) {
      iVar9 = 0;
      iVar6 = 0;
    }
    else {
      pbVar8 = src + -1;
      uVar10 = 0;
      iVar6 = 0;
      iVar9 = 0;
      do {
        iVar6 = iVar6 + (uint)pbVar8[-1];
        iVar9 = iVar9 + (uint)*pbVar8;
        uVar10 = uVar10 + 2;
        pbVar8 = pbVar8 + -2;
      } while (uVar10 < (uint)(h * 2));
    }
    if ((avail_cu & 1) == 0) {
      sVar5 = (short)(iVar6 + (h >> 1) >> (g_tbl_log2[h] & 0x1fU));
      iVar6 = iVar9 + (h >> 1) >> (g_tbl_log2[h] & 0x1fU);
    }
    else {
      if (0 < (int)uVar1) {
        uVar10 = 0;
        do {
          lVar2 = uVar10 + 2;
          lVar3 = uVar10 + 3;
          uVar10 = uVar10 + 2;
          iVar6 = iVar6 + (uint)src[lVar2];
          iVar9 = iVar9 + (uint)src[lVar3];
        } while (uVar10 < uVar1);
      }
      iVar7 = h + w >> 1;
      iVar4 = (int)(0x1000 / (long)(h + w));
      sVar5 = (short)((iVar6 + iVar7) * iVar4 >> 0xc);
      iVar6 = (iVar7 + iVar9) * iVar4 >> 0xc;
    }
  }
  if (h != 0) {
    do {
      if (0 < w) {
        uVar10 = 0;
        do {
          *(short *)(dst + uVar10 * 2) = (short)(iVar6 << 8) + sVar5;
          uVar10 = uVar10 + 1;
        } while ((uint)w != uVar10);
      }
      h = h + -1;
      dst = dst + i_dst;
    } while (h != 0);
  }
  return;
}

Assistant:

void ipred_dc_uv(pel *src, pel *dst, int i_dst, int w, int h, u16 avail_cu, int bit_depth)
{
    uavs3d_assert(g_tbl_log2[w] >= 2);
    uavs3d_assert(g_tbl_log2[h] >= 2);

    int dc_u = 0, dc_v = 0;
    int i, j;
    int w2 = w << 1;
    int h2 = h << 1;

    if (IS_AVAIL(avail_cu, AVAIL_LE)) {
        for (i = 0; i < h2; i += 2) {
            dc_u += src[-i - 2];
            dc_v += src[-i - 1];
        }
        if (IS_AVAIL(avail_cu, AVAIL_UP)) {
            for (j = 0; j < w2; j += 2) {
                dc_u += src[j + 2];
                dc_v += src[j + 3];
            }
            dc_u = (dc_u + ((w + h) >> 1)) * (4096 / (w + h)) >> 12;
            dc_v = (dc_v + ((w + h) >> 1)) * (4096 / (w + h)) >> 12;
        } else {
            dc_u = (dc_u + (h >> 1)) >> g_tbl_log2[h];
            dc_v = (dc_v + (h >> 1)) >> g_tbl_log2[h];
        }
    } else if (IS_AVAIL(avail_cu, AVAIL_UP)) {
        for (j = 0; j < w2; j += 2) {
            dc_u += src[j + 2];
            dc_v += src[j + 3];
        }
        dc_u = (dc_u + (w >> 1)) >> g_tbl_log2[w];
        dc_v = (dc_v + (w >> 1)) >> g_tbl_log2[w];
    } else {
        dc_u = dc_v = 1 << (bit_depth - 1);
    }

    int shift = sizeof(pel) * 8;
    int uv_pixel = (dc_v << shift) + dc_u;

    while (h--) {
        com_mset_2pel(dst, uv_pixel, w);
        dst += i_dst;
    }
}